

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O2

void helper_vmload_x86_64(CPUX86State *env,int aflag)

{
  CPUState *cs;
  uint64_t uVar1;
  CPUX86State *__mptr;
  ulong uVar2;
  uintptr_t unaff_retaddr;
  
  cpu_svm_check_intercept_param_x86_64(env,0x82,0,unaff_retaddr);
  uVar2 = env->regs[0] & 0xffffffff;
  if (aflag == 2) {
    uVar2 = env->regs[0];
  }
  cs = (CPUState *)(env[-6].mtrr_var + 4);
  svm_load_seg_cache(env,uVar2 + 0x440,4);
  svm_load_seg_cache(env,uVar2 + 0x450,5);
  svm_load_seg(env,uVar2 + 0x490,&env->tr);
  svm_load_seg(env,uVar2 + 0x470,&env->ldt);
  uVar1 = x86_ldq_phys_x86_64(cs,uVar2 + 0x620);
  env->kernelgsbase = uVar1;
  uVar1 = x86_ldq_phys_x86_64(cs,uVar2 + 0x608);
  env->lstar = uVar1;
  uVar1 = x86_ldq_phys_x86_64(cs,uVar2 + 0x610);
  env->cstar = uVar1;
  uVar1 = x86_ldq_phys_x86_64(cs,uVar2 + 0x618);
  env->fmask = uVar1;
  uVar1 = x86_ldq_phys_x86_64(cs,uVar2 + 0x600);
  env->star = uVar1;
  uVar1 = x86_ldq_phys_x86_64(cs,uVar2 + 0x628);
  env->sysenter_cs = (uint32_t)uVar1;
  uVar1 = x86_ldq_phys_x86_64(cs,uVar2 + 0x630);
  env->sysenter_esp = uVar1;
  uVar1 = x86_ldq_phys_x86_64(cs,uVar2 + 0x638);
  env->sysenter_eip = uVar1;
  return;
}

Assistant:

void helper_vmload(CPUX86State *env, int aflag)
{
    CPUState *cs = env_cpu(env);
    target_ulong addr;

    cpu_svm_check_intercept_param(env, SVM_EXIT_VMLOAD, 0, GETPC());

    if (aflag == 2) {
        addr = env->regs[R_EAX];
    } else {
        addr = (uint32_t)env->regs[R_EAX];
    }

    // qemu_log_mask(CPU_LOG_TB_IN_ASM, "vmload! " TARGET_FMT_lx
    //               "\nFS: %016" PRIx64 " | " TARGET_FMT_lx "\n",
    //               addr, x86_ldq_phys(cs, addr + offsetof(struct vmcb,
    //                                                       save.fs.base)),
    //               env->segs[R_FS].base);

    svm_load_seg_cache(env, addr + offsetof(struct vmcb, save.fs), R_FS);
    svm_load_seg_cache(env, addr + offsetof(struct vmcb, save.gs), R_GS);
    svm_load_seg(env, addr + offsetof(struct vmcb, save.tr), &env->tr);
    svm_load_seg(env, addr + offsetof(struct vmcb, save.ldtr), &env->ldt);

#ifdef TARGET_X86_64
    env->kernelgsbase = x86_ldq_phys(cs, addr + offsetof(struct vmcb,
                                                 save.kernel_gs_base));
    env->lstar = x86_ldq_phys(cs, addr + offsetof(struct vmcb, save.lstar));
    env->cstar = x86_ldq_phys(cs, addr + offsetof(struct vmcb, save.cstar));
    env->fmask = x86_ldq_phys(cs, addr + offsetof(struct vmcb, save.sfmask));
#endif
    env->star = x86_ldq_phys(cs, addr + offsetof(struct vmcb, save.star));
    env->sysenter_cs = x86_ldq_phys(cs,
                                addr + offsetof(struct vmcb, save.sysenter_cs));
    env->sysenter_esp = x86_ldq_phys(cs, addr + offsetof(struct vmcb,
                                                 save.sysenter_esp));
    env->sysenter_eip = x86_ldq_phys(cs, addr + offsetof(struct vmcb,
                                                 save.sysenter_eip));
}